

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O0

void __thiscall
t_swift_generator::generate_swift_service_client_recv_function_implementation
          (t_swift_generator *this,ostream *out,t_service *tservice,t_function *tfunction,
          bool needs_protocol)

{
  bool bVar1;
  uint uVar2;
  ostream *poVar3;
  string *psVar4;
  t_type *ptVar5;
  members_type *pmVar6;
  t_struct *ptVar7;
  reference pptVar8;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_130
  ;
  t_field **local_128;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_120
  ;
  const_iterator x_iter_1;
  vector<t_field_*,_std::allocator<t_field_*>_> *xceptions_1;
  t_struct *xs_1;
  string resultname_1;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_c8;
  t_field **local_c0;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_b8;
  const_iterator x_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *xceptions;
  t_struct *xs;
  string return_type_name;
  string resultname;
  string local_50;
  byte local_29;
  t_function *ptStack_28;
  bool needs_protocol_local;
  t_function *tfunction_local;
  t_service *tservice_local;
  ostream *out_local;
  t_swift_generator *this_local;
  
  local_29 = needs_protocol;
  ptStack_28 = tfunction;
  tfunction_local = (t_function *)tservice;
  tservice_local = (t_service *)out;
  out_local = (ostream *)this;
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"private func recv_");
  psVar4 = t_function::get_name_abi_cxx11_(ptStack_28);
  poVar3 = std::operator<<(poVar3,(string *)psVar4);
  std::operator<<(poVar3,"(");
  if ((this->gen_cocoa_ & 1U) != 0) {
    if ((local_29 & 1) != 0) {
      std::operator<<((ostream *)tservice_local,"__inProtocol: TProtocol");
    }
    std::operator<<((ostream *)tservice_local,") throws");
    ptVar5 = t_function::get_returntype(ptStack_28);
    uVar2 = (*(ptVar5->super_t_doc)._vptr_t_doc[4])();
    if ((uVar2 & 1) == 0) {
      poVar3 = std::operator<<((ostream *)tservice_local," -> ");
      ptVar5 = t_function::get_returntype(ptStack_28);
      type_name_abi_cxx11_
                ((string *)(resultname_1.field_2._M_local_buf + 8),this,ptVar5,false,false);
      std::operator<<(poVar3,(string *)(resultname_1.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(resultname_1.field_2._M_local_buf + 8));
    }
    block_open(this,(ostream *)tservice_local);
    std::operator<<((ostream *)tservice_local,(string *)&::endl_abi_cxx11_);
    poVar3 = t_generator::indent((t_generator *)this,(ostream *)tservice_local);
    poVar3 = std::operator<<(poVar3,"try __inProtocol.readResultMessageBegin() ");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    function_result_helper_struct_type_abi_cxx11_
              ((string *)&xs_1,this,(t_service *)tfunction_local,ptStack_28);
    t_generator::indent((t_generator *)this,(ostream *)tservice_local);
    ptVar5 = t_function::get_returntype(ptStack_28);
    uVar2 = (*(ptVar5->super_t_doc)._vptr_t_doc[4])();
    if ((uVar2 & 1) == 0) {
LAB_0048cdf6:
      std::operator<<((ostream *)tservice_local,"let __result = ");
    }
    else {
      ptVar7 = t_function::get_xceptions(ptStack_28);
      pmVar6 = t_struct::get_members(ptVar7);
      bVar1 = std::vector<t_field_*,_std::allocator<t_field_*>_>::empty(pmVar6);
      if (!bVar1) goto LAB_0048cdf6;
    }
    poVar3 = std::operator<<((ostream *)tservice_local,"try ");
    poVar3 = std::operator<<(poVar3,(string *)&xs_1);
    poVar3 = std::operator<<(poVar3,".readValueFromProtocol(__inProtocol)");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    poVar3 = t_generator::indent((t_generator *)this,(ostream *)tservice_local);
    poVar3 = std::operator<<(poVar3,"try __inProtocol.readMessageEnd()");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    ptVar5 = t_function::get_returntype(ptStack_28);
    uVar2 = (*(ptVar5->super_t_doc)._vptr_t_doc[4])();
    if ((uVar2 & 1) == 0) {
      poVar3 = t_generator::indent((t_generator *)this,(ostream *)tservice_local);
      std::operator<<(poVar3,"if let __success = __result.success");
      block_open(this,(ostream *)tservice_local);
      poVar3 = t_generator::indent((t_generator *)this,(ostream *)tservice_local);
      poVar3 = std::operator<<(poVar3,"return __success");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      block_close(this,(ostream *)tservice_local,true);
    }
    ptVar7 = t_function::get_xceptions(ptStack_28);
    x_iter_1._M_current = (t_field **)t_struct::get_members(ptVar7);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    __normal_iterator(&local_120);
    local_128 = (t_field **)
                std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(x_iter_1._M_current);
    local_120._M_current = local_128;
    while( true ) {
      local_130._M_current =
           (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(x_iter_1._M_current);
      bVar1 = __gnu_cxx::operator!=(&local_120,&local_130);
      if (!bVar1) break;
      poVar3 = t_generator::indent((t_generator *)this,(ostream *)tservice_local);
      poVar3 = std::operator<<(poVar3,"if let ");
      pptVar8 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_120);
      psVar4 = t_field::get_name_abi_cxx11_(*pptVar8);
      poVar3 = std::operator<<(poVar3,(string *)psVar4);
      poVar3 = std::operator<<(poVar3," = __result.");
      pptVar8 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_120);
      psVar4 = t_field::get_name_abi_cxx11_(*pptVar8);
      std::operator<<(poVar3,(string *)psVar4);
      block_open(this,(ostream *)tservice_local);
      poVar3 = t_generator::indent((t_generator *)this,(ostream *)tservice_local);
      poVar3 = std::operator<<(poVar3,"throw ");
      pptVar8 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_120);
      psVar4 = t_field::get_name_abi_cxx11_(*pptVar8);
      poVar3 = std::operator<<(poVar3,(string *)psVar4);
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      block_close(this,(ostream *)tservice_local,true);
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      operator++(&local_120);
    }
    ptVar5 = t_function::get_returntype(ptStack_28);
    uVar2 = (*(ptVar5->super_t_doc)._vptr_t_doc[4])();
    if ((uVar2 & 1) == 0) {
      poVar3 = t_generator::indent((t_generator *)this,(ostream *)tservice_local);
      poVar3 = std::operator<<(poVar3,"throw NSError(");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      t_generator::indent_up((t_generator *)this);
      poVar3 = t_generator::indent((t_generator *)this,(ostream *)tservice_local);
      poVar3 = std::operator<<(poVar3,"domain: TApplicationErrorDomain, ");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      poVar3 = t_generator::indent((t_generator *)this,(ostream *)tservice_local);
      poVar3 = std::operator<<(poVar3,"code: Int(TApplicationError.MissingResult.rawValue),");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      poVar3 = t_generator::indent((t_generator *)this,(ostream *)tservice_local);
      poVar3 = std::operator<<(poVar3,"userInfo: [TApplicationErrorMethodKey: \"");
      psVar4 = t_function::get_name_abi_cxx11_(ptStack_28);
      poVar3 = std::operator<<(poVar3,(string *)psVar4);
      poVar3 = std::operator<<(poVar3,"\"])");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      t_generator::indent_down((t_generator *)this);
    }
    std::__cxx11::string::~string((string *)&xs_1);
    goto LAB_0048d3dc;
  }
  if ((local_29 & 1) != 0) {
    std::operator<<((ostream *)tservice_local,"on inProtocol: TProtocol");
  }
  std::operator<<((ostream *)tservice_local,") throws");
  ptVar5 = t_function::get_returntype(ptStack_28);
  uVar2 = (*(ptVar5->super_t_doc)._vptr_t_doc[4])();
  if ((uVar2 & 1) == 0) {
    poVar3 = std::operator<<((ostream *)tservice_local," -> ");
    ptVar5 = t_function::get_returntype(ptStack_28);
    type_name_abi_cxx11_(&local_50,this,ptVar5,false,false);
    std::operator<<(poVar3,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  block_open(this,(ostream *)tservice_local);
  poVar3 = t_generator::indent((t_generator *)this,(ostream *)tservice_local);
  poVar3 = std::operator<<(poVar3,"try inProtocol.readResultMessageBegin() ");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  function_result_helper_struct_type_abi_cxx11_
            ((string *)((long)&return_type_name.field_2 + 8),this,(t_service *)tfunction_local,
             ptStack_28);
  t_generator::indent((t_generator *)this,(ostream *)tservice_local);
  ptVar5 = t_function::get_returntype(ptStack_28);
  uVar2 = (*(ptVar5->super_t_doc)._vptr_t_doc[4])();
  if ((uVar2 & 1) == 0) {
LAB_0048c6f3:
    std::operator<<((ostream *)tservice_local,"let result = ");
  }
  else {
    ptVar7 = t_function::get_xceptions(ptStack_28);
    pmVar6 = t_struct::get_members(ptVar7);
    bVar1 = std::vector<t_field_*,_std::allocator<t_field_*>_>::empty(pmVar6);
    if (!bVar1) goto LAB_0048c6f3;
    std::operator<<((ostream *)tservice_local,"_ = ");
  }
  ptVar5 = t_function::get_returntype(ptStack_28);
  type_name_abi_cxx11_((string *)&xs,this,ptVar5,false,false);
  poVar3 = std::operator<<((ostream *)tservice_local,"try ");
  poVar3 = std::operator<<(poVar3,(string *)(return_type_name.field_2._M_local_buf + 8));
  poVar3 = std::operator<<(poVar3,".read(from: inProtocol)");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = t_generator::indent((t_generator *)this,(ostream *)tservice_local);
  poVar3 = std::operator<<(poVar3,"try inProtocol.readMessageEnd()");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  ptVar5 = t_function::get_returntype(ptStack_28);
  uVar2 = (*(ptVar5->super_t_doc)._vptr_t_doc[4])();
  if ((uVar2 & 1) == 0) {
    poVar3 = t_generator::indent((t_generator *)this,(ostream *)tservice_local);
    std::operator<<(poVar3,"if let success = result.success");
    block_open(this,(ostream *)tservice_local);
    poVar3 = t_generator::indent((t_generator *)this,(ostream *)tservice_local);
    poVar3 = std::operator<<(poVar3,"return success");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    block_close(this,(ostream *)tservice_local,true);
  }
  ptVar7 = t_function::get_xceptions(ptStack_28);
  x_iter._M_current = (t_field **)t_struct::get_members(ptVar7);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&local_b8);
  local_c0 = (t_field **)
             std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(x_iter._M_current);
  local_b8._M_current = local_c0;
  while( true ) {
    local_c8._M_current =
         (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(x_iter._M_current);
    bVar1 = __gnu_cxx::operator!=(&local_b8,&local_c8);
    if (!bVar1) break;
    poVar3 = t_generator::indent((t_generator *)this,(ostream *)tservice_local);
    poVar3 = std::operator<<(poVar3,"if let ");
    pptVar8 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_b8);
    psVar4 = t_field::get_name_abi_cxx11_(*pptVar8);
    poVar3 = std::operator<<(poVar3,(string *)psVar4);
    poVar3 = std::operator<<(poVar3," = result.");
    pptVar8 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_b8);
    psVar4 = t_field::get_name_abi_cxx11_(*pptVar8);
    std::operator<<(poVar3,(string *)psVar4);
    block_open(this,(ostream *)tservice_local);
    poVar3 = t_generator::indent((t_generator *)this,(ostream *)tservice_local);
    poVar3 = std::operator<<(poVar3,"throw ");
    pptVar8 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_b8);
    psVar4 = t_field::get_name_abi_cxx11_(*pptVar8);
    poVar3 = std::operator<<(poVar3,(string *)psVar4);
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    block_close(this,(ostream *)tservice_local,true);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_b8);
  }
  ptVar5 = t_function::get_returntype(ptStack_28);
  uVar2 = (*(ptVar5->super_t_doc)._vptr_t_doc[4])();
  if ((uVar2 & 1) == 0) {
    poVar3 = t_generator::indent((t_generator *)this,(ostream *)tservice_local);
    poVar3 = std::operator<<(poVar3,"throw TApplicationError(error: .missingResult(methodName: \"");
    psVar4 = t_function::get_name_abi_cxx11_(ptStack_28);
    poVar3 = std::operator<<(poVar3,(string *)psVar4);
    poVar3 = std::operator<<(poVar3,"\"))");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  }
  std::__cxx11::string::~string((string *)&xs);
  std::__cxx11::string::~string((string *)(return_type_name.field_2._M_local_buf + 8));
LAB_0048d3dc:
  block_close(this,(ostream *)tservice_local,true);
  std::operator<<((ostream *)tservice_local,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_swift_generator::generate_swift_service_client_recv_function_implementation(ostream& out,
                                                                                   t_service* tservice,
                                                                                   t_function* tfunction,
                                                                                   bool needs_protocol) {

  // Open function
  indent(out) << "private func recv_" << tfunction->get_name() << "(";
  if (!gen_cocoa_) {
    if (needs_protocol) {
      out << "on inProtocol: TProtocol";
    }
    out << ") throws";
    if (!tfunction->get_returntype()->is_void()) {
      out << " -> " << type_name(tfunction->get_returntype());
    }

    block_open(out);

    // check for an exception

    indent(out) << "try inProtocol.readResultMessageBegin() " << endl;

    string resultname = function_result_helper_struct_type(tservice, tfunction);
    indent(out);
    if (!tfunction->get_returntype()->is_void() || !tfunction->get_xceptions()->get_members().empty()) {
      out << "let result = ";
    } else {
      out << "_ = ";
    }

    string return_type_name = type_name(tfunction->get_returntype());
    out << "try " << resultname << ".read(from: inProtocol)" << endl;

    indent(out) << "try inProtocol.readMessageEnd()" << endl << endl;

    // Careful, only return _result if not a void function
    if (!tfunction->get_returntype()->is_void()) {
      indent(out) << "if let success = result.success";
      block_open(out);
      indent(out) << "return success" << endl;
      block_close(out);
    }

    t_struct* xs = tfunction->get_xceptions();
    const vector<t_field*>& xceptions = xs->get_members();
    vector<t_field*>::const_iterator x_iter;

    for (x_iter = xceptions.begin(); x_iter != xceptions.end(); ++x_iter) {
      indent(out) << "if let " << (*x_iter)->get_name() << " = result." << (*x_iter)->get_name();
      block_open(out);
      indent(out) << "throw " << (*x_iter)->get_name() << endl;
      block_close(out);
    }

    // If you get here it's an exception, unless a void function
    if (!tfunction->get_returntype()->is_void()) {
      indent(out) << "throw TApplicationError(error: .missingResult(methodName: \""
                  << tfunction->get_name() << "\"))" << endl;
    }
  } else {
    if (needs_protocol) {
      out << "__inProtocol: TProtocol";
    }

    out << ") throws";

    if (!tfunction->get_returntype()->is_void()) {
      out << " -> " << type_name(tfunction->get_returntype());
    }

    block_open(out);

    // check for an exception
    out << endl;
    indent(out) << "try __inProtocol.readResultMessageBegin() " << endl << endl;
    string resultname = function_result_helper_struct_type(tservice, tfunction);
    indent(out);
    if (!tfunction->get_returntype()->is_void() || !tfunction->get_xceptions()->get_members().empty()) {
      out << "let __result = ";
    }
    out << "try " << resultname << ".readValueFromProtocol(__inProtocol)" << endl << endl;

    indent(out) << "try __inProtocol.readMessageEnd()" << endl << endl;

    // Careful, only return _result if not a void function
    if (!tfunction->get_returntype()->is_void()) {
      indent(out) << "if let __success = __result.success";
      block_open(out);
      indent(out) << "return __success" << endl;
      block_close(out);
    }

    t_struct* xs = tfunction->get_xceptions();
    const vector<t_field*>& xceptions = xs->get_members();
    vector<t_field*>::const_iterator x_iter;

    for (x_iter = xceptions.begin(); x_iter != xceptions.end(); ++x_iter) {
      indent(out) << "if let " << (*x_iter)->get_name() << " = __result." << (*x_iter)->get_name();
      block_open(out);
      indent(out) << "throw " << (*x_iter)->get_name() << endl;
      block_close(out);
    }

    // If you get here it's an exception, unless a void function
    if (!tfunction->get_returntype()->is_void()) {
      indent(out) << "throw NSError(" << endl;
      indent_up();
      indent(out) << "domain: TApplicationErrorDomain, " << endl;
      indent(out) << "code: Int(TApplicationError.MissingResult.rawValue)," << endl;
      indent(out) << "userInfo: [TApplicationErrorMethodKey: \"" << tfunction->get_name() << "\"])" << endl;
      indent_down();
    }
  }

  // Close function
  block_close(out);
  out << endl;
}